

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall Clasp::Solver::Solver(Solver *this,SharedContext *ctx,uint32 id)

{
  Var VVar1;
  uint in_EDX;
  undefined8 in_RSI;
  RNG *in_RDI;
  Var trueVar;
  ValueRep in_stack_ffffffffffffff3b;
  Var in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  Assignment *this_00;
  Assignment *in_stack_ffffffffffffff60;
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
  *this_01;
  
  RNG::RNG(in_RDI,1);
  bk_lib::pod_vector<unsigned_char,_std::allocator<unsigned_char>_>::pod_vector
            ((pod_vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff60)
  ;
  LowerBound::LowerBound((LowerBound *)(in_RDI + 6));
  SolverStats::SolverStats
            ((SolverStats *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  *(undefined8 *)(in_RDI + 0x1a) = in_RSI;
  SolverStrategies::SolverStrategies((SolverStrategies *)0x1e539c);
  SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *)(in_RDI + 0x1e),
             (DecisionHeuristic *)&null_heuristic_g,Retain);
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 **)(in_RDI + 0x22) = &sent_list;
  *(undefined8 *)(in_RDI + 0x24) = 0;
  *(undefined8 *)(in_RDI + 0x26) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x2a) = 0;
  *(undefined8 *)(in_RDI + 0x2c) = 0;
  SmallClauseAlloc::SmallClauseAlloc((SmallClauseAlloc *)(in_RDI + 0x2e));
  Assignment::Assignment(in_stack_ffffffffffffff60);
  DecisionLevels::DecisionLevels
            ((DecisionLevels *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::pod_vector
            ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
             in_stack_ffffffffffffff60);
  bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::pod_vector
            ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
             in_stack_ffffffffffffff60);
  PropagatorList::PropagatorList((PropagatorList *)(in_RDI + 0x5a));
  bk_lib::
  pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
  ::pod_vector((pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
                *)in_stack_ffffffffffffff60);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
            (&in_stack_ffffffffffffff60->trail);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
            (&in_stack_ffffffffffffff60->trail);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
            (&in_stack_ffffffffffffff60->trail);
  this_01 = (pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
             *)(in_RDI + 0x6c);
  bk_lib::
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
  pod_vector(this_01);
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pod_vector
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
  this_00 = (Assignment *)(in_RDI + 0x74);
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pod_vector
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
  ImpliedList::ImpliedList
            ((ImpliedList *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  ConstraintInfo::ConstraintInfo((ConstraintInfo *)(in_RDI + 0x7e),Conflict);
  Literal::Literal((Literal *)(in_RDI + 0x7f));
  in_RDI[0x80].seed_ = 0;
  in_RDI[0x81].seed_ = in_RDI[0x81].seed_ & 0xc0000000;
  *(byte *)((long)&in_RDI[0x81].seed_ + 3) = *(byte *)((long)&in_RDI[0x81].seed_ + 3) & 0xbf;
  *(byte *)((long)&in_RDI[0x81].seed_ + 3) = *(byte *)((long)&in_RDI[0x81].seed_ + 3) & 0x7f;
  *(undefined1 *)&in_RDI[0x82].seed_ = 0;
  VVar1 = Assignment::addVar(this_00);
  Assignment::setValue
            ((Assignment *)CONCAT44(VVar1,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c,
             in_stack_ffffffffffffff3b);
  markSeen((Solver *)CONCAT44(VVar1,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c);
  *(ulong *)(in_RDI + 0x1c) = *(ulong *)(in_RDI + 0x1c) & 0x3ffffffffffffff | (ulong)in_EDX << 0x3a;
  return;
}

Assistant:

Solver::Solver(SharedContext* ctx, uint32 id)
	: shared_(ctx)
	, heuristic_(&null_heuristic_g, Ownership_t::Retain)
	, ccMin_(0)
	, postHead_(&sent_list)
	, undoHead_(0)
	, enum_(0)
	, memUse_(0)
	, lazyRem_(0)
	, dynLimit_(0)
	, ccInfo_(Constraint_t::Conflict)
	, dbIdx_(0)
	, lastSimp_(0)
	, shufSimp_(0)
	, initPost_(0)
	, splitReq_(false) {
	Var trueVar = assign_.addVar();
	assign_.setValue(trueVar, value_true);
	markSeen(trueVar);
	strategy_.id = id;
}